

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles2::Functional::eval_selection_bvec2(ShaderEvalContext *c)

{
  float fVar1;
  float *pfVar2;
  VecAccess<float,_4,_2> local_50;
  Vector<float,_2> local_40;
  undefined1 local_38 [10];
  Vector<bool,_2> local_2e;
  Vector<float,_2> local_2c;
  undefined1 local_24 [8];
  Vector<bool,_2> local_1c;
  Functional local_1a [2];
  Vector<float,_2> local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  pfVar2 = tcu::Vector<float,_4>::z(c->in);
  fVar1 = *pfVar2;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_24,(int)local_10 + 0x40,1);
  tcu::Vector<float,_2>::Vector(&local_2c,0.0,0.0);
  tcu::greaterThan<float,2>((tcu *)&local_1c,(Vector<float,_2> *)local_24,&local_2c);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_38,(int)local_10 + 0x50,2);
  tcu::Vector<float,_2>::Vector(&local_40,0.0,0.0);
  tcu::greaterThan<float,2>((tcu *)&local_2e,(Vector<float,_2> *)local_38,&local_40);
  selection<tcu::Vector<bool,2>>(local_1a,0.0 < fVar1,&local_1c,&local_2e);
  tcu::Vector<bool,_2>::asFloat((Vector<bool,_2> *)&local_18);
  local_50 = tcu::Vector<float,_4>::yz(&local_10->color);
  tcu::VecAccess<float,_4,_2>::operator=(&local_50,&local_18);
  return;
}

Assistant:

void eval_selection_bvec2	(ShaderEvalContext& c) { c.color.yz()	= selection(c.in[0].z() > 0.0f,			greaterThan(c.in[1].swizzle(1, 0), Vec2(0.0f, 0.0f)),					greaterThan(c.in[2].swizzle(2, 1), Vec2(0.0f, 0.0f))).asFloat(); }